

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall QIconModeViewBase::filterDragMoveEvent(QIconModeViewBase *this,QDragMoveEvent *e)

{
  QAbstractItemModel *pQVar1;
  byte bVar2;
  bool bVar3;
  Movement MVar4;
  Int IVar5;
  QListView *pQVar6;
  QIconModeViewBase *pQVar7;
  QAbstractItemViewPrivate *this_00;
  qsizetype qVar8;
  QModelIndex *pQVar9;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int iVar10;
  QRect *in_RSI;
  QIconModeViewBase *in_RDI;
  long in_FS_OFFSET;
  bool wasAccepted;
  QList<QModelIndex> intersectVector;
  QRect rect;
  QModelIndex index;
  QRect itemsRect;
  undefined4 in_stack_fffffffffffffe68;
  ItemFlag in_stack_fffffffffffffe6c;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  QWidget *in_stack_fffffffffffffe78;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe80;
  QList<QModelIndex> *in_stack_fffffffffffffe90;
  QIconModeViewBase *this_01;
  undefined7 in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_124;
  QPointF local_120;
  QPoint local_110;
  undefined1 *local_108;
  QIconModeViewBase *local_100;
  QAbstractItemModel *local_f8;
  undefined1 *local_f0;
  QIconModeViewBase *local_e8;
  QAbstractItemModel *local_e0;
  QList<QModelIndex> local_d8;
  QSize local_c0;
  QPoint local_b8;
  QPointF local_b0;
  QPoint local_a0;
  QPoint local_98;
  QPoint local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QIconModeViewBase *local_70;
  QAbstractItemModel *local_68;
  QPoint local_60;
  QRect local_58;
  QPointF local_48;
  QPoint local_38;
  QPoint local_30;
  QRect local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = in_RDI;
  bVar2 = QEvent::isAccepted((QEvent *)in_RSI);
  QDragMoveEvent::ignore((QDragMoveEvent *)0x885b2a);
  pQVar6 = (QListView *)QDropEvent::source();
  if ((pQVar6 == (in_RDI->super_QCommonListViewBase).qq) &&
     (this_01 = in_RDI,
     bVar3 = QAbstractItemViewPrivate::canDrop
                       ((QAbstractItemViewPrivate *)
                        CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                        (QDropEvent *)pQVar7), bVar3)) {
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])QIconModeViewBase::itemsRect(this_01,in_stack_fffffffffffffe90);
    pQVar7 = (QIconModeViewBase *)QCommonListViewBase::viewport(&this_01->super_QCommonListViewBase)
    ;
    local_30 = draggedItemsDelta(pQVar7);
    local_28 = QRect::translated(in_RSI,(QPoint *)CONCAT17(bVar2,in_stack_fffffffffffffea0));
    QWidget::update(in_stack_fffffffffffffe78,
                    (QRect *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    local_48 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe78);
    local_38 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffe80);
    this_01->draggedItemsPos = local_38;
    this_00 = (QAbstractItemViewPrivate *)
              QCommonListViewBase::viewport(&this_01->super_QCommonListViewBase);
    local_60 = draggedItemsDelta(pQVar7);
    local_58 = QRect::translated(in_RSI,(QPoint *)CONCAT17(bVar2,in_stack_fffffffffffffea0));
    QWidget::update(in_stack_fffffffffffffe78,
                    (QRect *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = (QIconModeViewBase *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x885ce1);
    MVar4 = QCommonListViewBase::movement(&this_01->super_QCommonListViewBase);
    if (MVar4 == Snap) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe78);
      local_a0 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffe80);
      local_b8 = QCommonListViewBase::offset
                           ((QCommonListViewBase *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_98 = ::operator+((QPoint *)in_stack_fffffffffffffe80,(QPoint *)in_stack_fffffffffffffe78
                            );
      local_90 = snapToGrid((QIconModeViewBase *)this_00,(QPoint *)pQVar7);
      local_c0 = QCommonListViewBase::gridSize
                           ((QCommonListViewBase *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QRect::QRect((QRect *)this_00,(QPoint *)pQVar7,(QSize *)in_stack_fffffffffffffe80);
      local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (*(this_01->super_QCommonListViewBase)._vptr_QCommonListViewBase[7])
                (&local_d8,this_01,&local_88);
      qVar8 = QList<QModelIndex>::size(&local_d8);
      if (qVar8 < 1) {
        QModelIndex::QModelIndex((QModelIndex *)0x885e55);
      }
      else {
        pQVar9 = QList<QModelIndex>::last
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_f0 = *(undefined1 **)pQVar9;
        in_RDI = (QIconModeViewBase *)pQVar9->i;
        local_e0 = (pQVar9->m).ptr;
        local_e8 = in_RDI;
      }
      local_78 = local_f0;
      local_70 = local_e8;
      local_68 = local_e0;
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x885e92);
    }
    else {
      in_stack_fffffffffffffe80 =
           (QAbstractItemViewPrivate *)(this_01->super_QCommonListViewBase).qq;
      local_120 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffe78);
      local_110 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffe80);
      (**(code **)((long)*(qreal *)&(in_stack_fffffffffffffe80->super_QAbstractScrollAreaPrivate).
                                    super_QFramePrivate.super_QWidgetPrivate + 0x1f0))
                (&local_108,in_stack_fffffffffffffe80,&local_110);
      local_78 = local_108;
      local_70 = local_100;
      local_68 = local_f8;
    }
    iVar10 = (int)&local_78;
    bVar3 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                      ((QListSpecialMethodsBase<QModelIndex> *)
                       CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    if (bVar3) {
      QDragMoveEvent::accept((QDragMoveEvent *)in_RSI,iVar10,__addr,(socklen_t *)in_RDI);
    }
    else {
      pQVar1 = (((this_01->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,&local_78);
      iVar10 = 8;
      local_124.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QFlags<Qt::ItemFlag>::operator&
                     ((QFlags<Qt::ItemFlag> *)
                      CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe6c);
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_124);
      if (IVar5 == 0) {
        bVar3 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        if (!bVar3) {
          QDragMoveEvent::accept((QDragMoveEvent *)in_RSI,iVar10,__addr_01,(socklen_t *)in_RDI);
        }
      }
      else {
        QDragMoveEvent::accept((QDragMoveEvent *)in_RSI,iVar10,__addr_00,(socklen_t *)in_RDI);
      }
    }
    QDropEvent::position((QDropEvent *)(this_01->super_QCommonListViewBase).dd);
    QPointF::toPoint((QPointF *)in_stack_fffffffffffffe80);
    bVar3 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,(QPoint *)pQVar7);
    if (bVar3) {
      QAbstractItemViewPrivate::startAutoScroll(in_stack_fffffffffffffe80);
    }
    bVar3 = true;
  }
  else {
    (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar2 & 1);
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QIconModeViewBase::filterDragMoveEvent(QDragMoveEvent *e)
{
    const bool wasAccepted = e->isAccepted();

    // ignore by default
    e->ignore();

    if (e->source() != qq || !dd->canDrop(e)) {
        // restore previous acceptance on failure
        e->setAccepted(wasAccepted);
        return false;
    }

    // get old dragged items rect
    QRect itemsRect = this->itemsRect(draggedItems);
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // update position
    draggedItemsPos = e->position().toPoint();
    // get new items rect
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // set the item under the cursor to current
    QModelIndex index;
    if (movement() == QListView::Snap) {
        QRect rect(snapToGrid(e->position().toPoint() + offset()), gridSize());
        const QList<QModelIndex> intersectVector = intersectingSet(rect);
        index = intersectVector.size() > 0 ? intersectVector.last() : QModelIndex();
    } else {
        index = qq->indexAt(e->position().toPoint());
    }
    // check if we allow drops here
    if (draggedItems.contains(index))
        e->accept(); // allow changing item position
    else if (dd->model->flags(index) & Qt::ItemIsDropEnabled)
        e->accept(); // allow dropping on dropenabled items
    else if (!index.isValid())
        e->accept(); // allow dropping in empty areas

    // the event was treated. do autoscrolling
    if (dd->shouldAutoScroll(e->position().toPoint()))
        dd->startAutoScroll();
    return true;
}